

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

bool __thiscall
testing::
PolymorphicMatcher<testing::internal::TrulyMatcher<(anonymous_namespace)::first_elements_are>_>::
MonomorphicImpl<const_std::vector<char,_std::allocator<char>_>_&>::MatchAndExplain
          (MonomorphicImpl<const_std::vector<char,_std::allocator<char>_>_&> *this,
          vector<char,_std::allocator<char>_> *x,MatchResultListener *listener)

{
  char *__first2;
  ulong uVar1;
  char *__first1;
  bool bVar2;
  
  __first2 = (x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
             _M_start;
  uVar1 = (this->impl_).predicate_.expected_._M_string_length;
  if ((uVar1 <= (ulong)((long)(x->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)__first2)) &&
     (__first1 = (this->impl_).predicate_.expected_._M_dataplus._M_p,
     bVar2 = std::__equal<true>::equal<char>(__first1,__first1 + uVar1,__first2), bVar2)) {
    return true;
  }
  MatchResultListener::operator<<(listener,(char (*) [35])"didn\'t satisfy the given predicate");
  return false;
}

Assistant:

bool MatchAndExplain(T x, MatchResultListener* listener) const override {
      return impl_.MatchAndExplain(x, listener);
    }